

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

int mbedtls_poly1305_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  uint local_2c;
  int ret;
  uint i;
  uchar mac [16];
  int verbose_local;
  
  local_2c = 0;
  while( true ) {
    if (1 < local_2c) {
      if (verbose != 0) {
        printf(anon_var_dwarf_17d4d + 8);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  Poly1305 test %u ",(ulong)local_2c);
    }
    uVar1 = mbedtls_poly1305_mac
                      (test_keys[local_2c],test_data[local_2c],test_data_len[local_2c],(uchar *)&ret
                      );
    if (uVar1 != 0) break;
    iVar2 = memcmp(&ret,test_mac + local_2c,0x10);
    if (iVar2 != 0) {
      if (verbose != 0) {
        printf("failed (mac)\n");
      }
      return -1;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    local_2c = local_2c + 1;
  }
  if (verbose != 0) {
    printf("error code: %i\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

int mbedtls_poly1305_self_test( int verbose )
{
    unsigned char mac[16];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  Poly1305 test %u ", i );

        ret = mbedtls_poly1305_mac( test_keys[i],
                                    test_data[i],
                                    test_data_len[i],
                                    mac );
        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( mac, test_mac[i], 16U ), ( "failed (mac)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}